

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O3

void event_night_time(tgestate_t *state)

{
  uint8_t *puVar1;
  attribute_t attrs;
  
  if ((state->hero_in_bed == '\0') && (state->in_solitary == '\0')) {
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xbf;
    state->vischars[0].route.index = ',';
    state->vischars[0].route.step = '\x01';
    set_route(state,state->vischars);
  }
  state->day_or_night = 0xff;
  attrs = choose_game_window_attributes(state);
  set_game_window_attributes(state,attrs);
  return;
}

Assistant:

static void event_night_time(tgestate_t *state)
{
  assert(state != NULL);

  if (state->hero_in_bed == 0)
  {
    static const route_t t = { routeindex_44_HUT2_RIGHT_TO_LEFT, 1 }; /* was BC */
    set_hero_route(state, &t);
  }
  set_day_or_night(state, 255);
}